

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_input_end(nk_context *ctx)

{
  nk_input *in;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3634,"void nk_input_end(struct nk_context *)");
  }
  if (ctx != (nk_context *)0x0) {
    if ((ctx->input).mouse.grab != '\0') {
      (ctx->input).mouse.grab = '\0';
    }
    if ((ctx->input).mouse.ungrab != '\0') {
      (ctx->input).mouse.grabbed = '\0';
      (ctx->input).mouse.ungrab = '\0';
      (ctx->input).mouse.grab = '\0';
    }
  }
  return;
}

Assistant:

NK_API void
nk_input_end(struct nk_context *ctx)
{
    struct nk_input *in;
    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;
    if (in->mouse.grab)
        in->mouse.grab = 0;
    if (in->mouse.ungrab) {
        in->mouse.grabbed = 0;
        in->mouse.ungrab = 0;
        in->mouse.grab = 0;
    }
}